

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void upb_Message_SetBaseFieldInt64(upb_Message *msg,upb_MiniTableField *f,int64_t value)

{
  upb_CType uVar1;
  int64_t local_18;
  
  local_18 = value;
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_Int64) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int64",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27c,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  if ((f->mode_dont_copy_me__upb_internal_use_only & 3) == 2) {
    if (0xbf < f->mode_dont_copy_me__upb_internal_use_only) {
      upb_Message_SetBaseField(msg,f,&local_18);
      return;
    }
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27e,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  __assert_fail("upb_MiniTableField_IsScalar(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x27d,
                "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt64(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int64_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int64);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_8Byte);
  upb_Message_SetBaseField(msg, f, &value);
}